

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

void __thiscall QTextTable::insertColumns(QTextTable *this,int pos,int num)

{
  QTextDocumentPrivate *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QTextTablePrivate *pQVar5;
  QTextTablePrivate *pQVar6;
  uint *puVar7;
  FragmentMap *pFVar8;
  int in_EDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  int bfmt;
  int cfmt;
  int position;
  int gridEnd;
  int gridIndex;
  int gridArrayOffset;
  int logicalGridIndex;
  int logicalGridIndexBeforePosition;
  int i;
  QTextFormatCollection *c;
  QTextDocumentPrivate *p;
  QTextTablePrivate *d;
  QList<QTextLength> columnWidths;
  int cell;
  QList<int> extendedSpans;
  QTextTableFormat tfmt;
  QTextCharFormat fmt_1;
  FragmentIterator it_1;
  QTextCharFormat fmt;
  FragmentIterator it;
  parameter_type in_stack_fffffffffffffe98;
  QTextDocumentPrivate *in_stack_fffffffffffffea0;
  QTextTablePrivate *in_stack_fffffffffffffea8;
  QTextFormatCollection *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  QTextTablePrivate *in_stack_fffffffffffffec8;
  FormatChangeMode in_stack_fffffffffffffedc;
  FormatChangeMode FVar9;
  QTextTablePrivate *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_f8;
  int in_stack_ffffffffffffff1c;
  int local_e0;
  int local_d4;
  int local_b4;
  int local_a8 [2];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  QChar local_86;
  uint local_84;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QTextTable *)0x8960c4);
  if (0 < in_EDX) {
    if ((pQVar5->dirty & 1U) != 0) {
      QTextTablePrivate::update
                ((QTextTablePrivate *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
      ;
    }
    if ((pQVar5->nCols < in_ESI) || (local_b4 = in_ESI, in_ESI < 0)) {
      local_b4 = pQVar5->nCols;
    }
    this_00 = (pQVar5->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    pQVar6 = (QTextTablePrivate *)QTextDocumentPrivate::formatCollection(this_00);
    QTextDocumentPrivate::beginEditBlock(this_00);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x89619f);
    for (local_d4 = 0; local_d4 < pQVar5->nRows; local_d4 = local_d4 + 1) {
      local_84 = 0xaaaaaaaa;
      if ((local_d4 == pQVar5->nRows + -1) && (local_b4 == pQVar5->nCols)) {
        local_84 = (pQVar5->super_QTextFramePrivate).fragment_end;
      }
      else {
        if (local_b4 < 1) {
          iVar4 = -1;
        }
        else {
          in_stack_fffffffffffffee0 = pQVar5;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                     (size_type)in_stack_fffffffffffffea8);
          iVar4 = QTextTablePrivate::findCellIndex
                            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
        }
        local_e0 = local_d4 * pQVar5->nCols + local_b4;
        FVar9 = in_stack_fffffffffffffedc;
        in_stack_fffffffffffffeec = iVar4;
        do {
          puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0
                                      ,(size_type)in_stack_fffffffffffffea8);
          local_84 = *puVar7;
          iVar3 = QTextTablePrivate::findCellIndex
                            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
          local_e0 = local_e0 + 1;
          in_stack_fffffffffffffedc = FVar9 & 0xffffff;
          if (iVar3 < iVar4) {
            in_stack_fffffffffffffedc =
                 CONCAT13(local_e0 < pQVar5->nRows * pQVar5->nCols,(int3)FVar9);
          }
          FVar9 = in_stack_fffffffffffffedc;
        } while ((char)(in_stack_fffffffffffffedc >> 0x18) != '\0');
        if ((iVar3 < iVar4) && (local_e0 == pQVar5->nRows * pQVar5->nCols)) {
          local_84 = (pQVar5->super_QTextFramePrivate).fragment_end;
        }
      }
      uVar1 = local_84;
      if (((local_b4 < 1) || (pQVar5->nCols <= local_b4)) ||
         (puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0
                                      ,(size_type)in_stack_fffffffffffffea8), uVar1 != *puVar7)) {
        if (((0 < local_d4) && (local_b4 < pQVar5->nCols)) &&
           (in_stack_fffffffffffffec4 = local_84,
           puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_fffffffffffffeb0,
                                       (size_type)in_stack_fffffffffffffea8),
           in_stack_fffffffffffffec4 == *puVar7)) {
          in_stack_ffffffffffffff1c = local_d4 * pQVar5->nCols + local_b4;
          iVar4 = pQVar5->nRows * pQVar5->nCols + -1;
          while( true ) {
            uVar1 = local_84;
            in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 & 0xffffff;
            if (in_stack_ffffffffffffff1c < iVar4) {
              puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffffeb0,
                                          (size_type)in_stack_fffffffffffffea8);
              in_stack_fffffffffffffec0 = CONCAT13(uVar1 == *puVar7,(int3)in_stack_fffffffffffffec0)
              ;
            }
            if ((char)(in_stack_fffffffffffffec0 >> 0x18) == '\0') break;
            in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c + 1;
          }
          if (in_stack_ffffffffffffff1c == iVar4) {
            local_84 = (pQVar5->super_QTextFramePrivate).fragment_end;
          }
          else {
            puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffffeb0,
                                        (size_type)in_stack_fffffffffffffea8);
            local_84 = *puVar7;
          }
        }
        local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pFVar8 = QTextDocumentPrivate::fragmentMap(this_00);
        QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator
                  ((ConstIterator *)local_38,pFVar8,local_84);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffea8 = pQVar6;
        QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x89675d);
        QTextFormatCollection::charFormat
                  (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        QTextCharFormat::setTableCellRowSpan
                  ((QTextCharFormat *)in_stack_fffffffffffffea8,
                   (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
        QTextCharFormat::setTableCellColumnSpan
                  ((QTextCharFormat *)in_stack_fffffffffffffea8,
                   (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
        QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x8967a3);
        QTextDocumentPrivate::formatCollection(this_00);
        QTextFormatCollection::indexForFormat
                  ((QTextFormatCollection *)in_stack_fffffffffffffec8,
                   (QTextFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        in_stack_fffffffffffffeb0 = QTextDocumentPrivate::formatCollection(this_00);
        QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x8967e7);
        QTextFormatCollection::indexForFormat
                  ((QTextFormatCollection *)in_stack_fffffffffffffec8,
                   (QTextFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x89680a);
        for (local_f8 = 0; local_f8 < in_EDX; local_f8 = local_f8 + 1) {
          in_stack_fffffffffffffea0 = this_00;
          QChar::QChar<char16_t,_true>(&local_86,L'﷐');
          QTextDocumentPrivate::insertBlock
                    (in_RDI,(QChar)(char16_t)((uint)in_stack_ffffffffffffff1c >> 0x10),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     (Operation)in_stack_fffffffffffffee0);
        }
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x896885);
      }
      else {
        bVar2 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)in_stack_fffffffffffffea0,
                           (int *)in_stack_fffffffffffffe98);
        if (!bVar2) {
          local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pFVar8 = QTextDocumentPrivate::fragmentMap(this_00);
          QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator
                    ((ConstIterator *)local_18,pFVar8,local_84);
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffec8 = pQVar6;
          QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x8964c2);
          QTextFormatCollection::charFormat
                    (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
          QTextCharFormat::tableCellColumnSpan((QTextCharFormat *)in_stack_fffffffffffffea0);
          QTextCharFormat::setTableCellColumnSpan
                    ((QTextCharFormat *)in_stack_fffffffffffffea8,
                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x896514);
          QTextDocumentPrivate::setCharFormat
                    (in_RDI,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (QTextCharFormat *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          pQVar5->dirty = true;
          QList<int>::operator<<
                    ((QList<int> *)in_stack_fffffffffffffea0,
                     (parameter_type)((ulong)in_stack_fffffffffffffe98 >> 0x20));
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x896561);
        }
      }
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    format((QTextTable *)in_stack_fffffffffffffeb0);
    QTextTableFormat::columns((QTextTableFormat *)in_stack_fffffffffffffea0);
    QTextTableFormat::setColumns
              ((QTextTableFormat *)in_stack_fffffffffffffea8,
               (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QTextTableFormat::columnWidthConstraints((QTextTableFormat *)in_stack_fffffffffffffe98);
    bVar2 = QList<QTextLength>::isEmpty((QList<QTextLength> *)0x89693f);
    if (!bVar2) {
      for (; 0 < in_EDX; in_EDX = in_EDX + -1) {
        in_stack_fffffffffffffe98 = (parameter_type)(long)local_b4;
        local_a8[1] = 0;
        local_a8[0] = local_b4 + -1;
        qMax<int>(local_a8 + 1,local_a8);
        QList<QTextLength>::at
                  ((QList<QTextLength> *)in_stack_fffffffffffffea0,
                   (qsizetype)in_stack_fffffffffffffe98);
        QList<QTextLength>::insert
                  ((QList<QTextLength> *)in_stack_fffffffffffffea8,
                   (qsizetype)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
    }
    QTextTableFormat::setColumnWidthConstraints
              ((QTextTableFormat *)in_stack_fffffffffffffea0,
               (QList<QTextLength> *)in_stack_fffffffffffffe98);
    QTextObject::setFormat
              ((QTextObject *)in_stack_fffffffffffffeb0,(QTextFormat *)in_stack_fffffffffffffea8);
    QTextDocumentPrivate::endEditBlock(in_stack_fffffffffffffea0);
    QList<QTextLength>::~QList((QList<QTextLength> *)0x896a0f);
    QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x896a1c);
    QList<int>::~QList((QList<int> *)0x896a29);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextTable::insertColumns(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nCols || pos < 0)
        pos = d->nCols;

//     qDebug() << "-------- insertCols" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    QList<int> extendedSpans;
    for (int i = 0; i < d->nRows; ++i) {
        int cell;
        if (i == d->nRows - 1 && pos == d->nCols) {
            cell = d->fragment_end;
        } else {
            int logicalGridIndexBeforePosition = pos > 0
                                                 ? d->findCellIndex(d->grid[i*d->nCols + pos - 1])
                                                 : -1;

            // Search for the logical insertion point by skipping past cells which are not the first
            // cell in a rowspan. This means any cell for which the logical grid index is
            // less than the logical cell index of the cell before the insertion.
            int logicalGridIndex;
            int gridArrayOffset = i*d->nCols + pos;
            do {
                cell = d->grid[gridArrayOffset];
                logicalGridIndex = d->findCellIndex(cell);
                gridArrayOffset++;
            } while (logicalGridIndex < logicalGridIndexBeforePosition
                     && gridArrayOffset < d->nRows*d->nCols);

            if (logicalGridIndex < logicalGridIndexBeforePosition
                && gridArrayOffset == d->nRows*d->nCols)
                cell = d->fragment_end;
        }

        if (pos > 0 && pos < d->nCols && cell == d->grid[i*d->nCols + pos - 1]) {
            // cell spans the insertion place, extend it
            if (!extendedSpans.contains(cell)) {
                QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                QTextCharFormat fmt = c->charFormat(it->format);
                fmt.setTableCellColumnSpan(fmt.tableCellColumnSpan() + num);
                p->setCharFormat(it.position(), 1, fmt);
                d->dirty = true;
                extendedSpans << cell;
            }
        } else {
            /* If the next cell is spanned from the row above, we need to find the right position
            to insert to */
            if (i > 0 && pos < d->nCols && cell == d->grid[(i-1) * d->nCols + pos]) {
                int gridIndex = i*d->nCols + pos;
                const int gridEnd = d->nRows * d->nCols - 1;
                while (gridIndex < gridEnd && cell == d->grid[gridIndex]) {
                    ++gridIndex;
                }
                if (gridIndex == gridEnd)
                    cell = d->fragment_end;
                else
                    cell = d->grid[gridIndex];
            }
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = c->charFormat(it->format);
            fmt.setTableCellRowSpan(1);
            fmt.setTableCellColumnSpan(1);
            Q_ASSERT(fmt.objectIndex() == objectIndex());
            int position = it.position();
            int cfmt = p->formatCollection()->indexForFormat(fmt);
            int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
            for (int i = 0; i < num; ++i)
                p->insertBlock(QTextBeginningOfFrame, position, bfmt, cfmt, QTextUndoCommand::MoveCursor);
        }
    }

    QTextTableFormat tfmt = format();
    tfmt.setColumns(tfmt.columns()+num);
    QList<QTextLength> columnWidths = tfmt.columnWidthConstraints();
    if (! columnWidths.isEmpty()) {
        for (int i = num; i > 0; --i)
            columnWidths.insert(pos, columnWidths.at(qMax(0, pos - 1)));
    }
    tfmt.setColumnWidthConstraints (columnWidths);
    QTextObject::setFormat(tfmt);

//     qDebug() << "-------- end insertCols" << pos << num;
    p->endEditBlock();
}